

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O0

void __thiscall
CItems::RenderFlag(CItems *this,CNetObj_Flag *pPrev,CNetObj_Flag *pCurrent,
                  CNetObj_GameDataFlag *pPrevGameDataFlag,CNetObj_GameDataFlag *pCurGameDataFlag)

{
  bool bVar1;
  IClient *this_00;
  IGraphics *pIVar2;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  vector2_base<float> in_RDI;
  CGameClient *in_R8;
  long in_FS_OFFSET;
  int FlagCarrier;
  float Size;
  CQuadItem QuadItem;
  vec2 Pos;
  undefined8 in_stack_ffffffffffffff78;
  int ClientID;
  CQuadItem *this_01;
  int in_stack_ffffffffffffff88;
  int ClientID_00;
  vector2_base<float> b;
  vector2_base<float> in_stack_ffffffffffffffb8;
  vector2_base<float> local_28;
  vector2_base<float> local_20;
  vector2_base<float> local_18;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_10;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_c;
  long local_8;
  
  ClientID = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ClientID_00 = 0x42280000;
  b = in_RDI;
  vector2_base<float>::vector2_base(&local_18,(float)*in_RSI,(float)in_RSI[1]);
  vector2_base<float>::vector2_base(&local_20,(float)*in_RDX,(float)in_RDX[1]);
  this_00 = CComponent::Client((CComponent *)0x16d6e1);
  IClient::IntraGameTick(this_00);
  _local_10 = mix<vector2_base<float>,float>
                        (in_stack_ffffffffffffffb8,b,(float)((ulong)in_R8 >> 0x20));
  if (in_R8 != (CGameClient *)0x0) {
    if ((in_RCX != (int *)0x0) &&
       (((in_RDX[2] == 0 &&
         (*in_RCX != *(int *)&(in_R8->super_IGameClient).super_IInterface._vptr_IInterface)) ||
        ((in_RDX[2] == 1 &&
         (in_RCX[1] !=
          *(int *)((long)&(in_R8->super_IGameClient).super_IInterface._vptr_IInterface + 4))))))) {
      vector2_base<float>::vector2_base(&local_28,(float)*in_RDX,(float)in_RDX[1]);
      _local_10 = local_28;
    }
    in_stack_ffffffffffffff88 = -1;
    if ((in_RDX[2] == 0) &&
       (-1 < *(int *)&(in_R8->super_IGameClient).super_IInterface._vptr_IInterface)) {
      in_stack_ffffffffffffff88 =
           *(int *)&(in_R8->super_IGameClient).super_IInterface._vptr_IInterface;
    }
    else if ((in_RDX[2] == 1) &&
            (-1 < *(int *)((long)&(in_R8->super_IGameClient).super_IInterface._vptr_IInterface + 4))
            ) {
      in_stack_ffffffffffffff88 =
           *(int *)((long)&(in_R8->super_IGameClient).super_IInterface._vptr_IInterface + 4);
    }
    if ((((-1 < in_stack_ffffffffffffff88) && (in_stack_ffffffffffffff88 < 0x40)) &&
        (bVar1 = CGameClient::ShouldUsePredicted((CGameClient *)in_RDI), bVar1)) &&
       (bVar1 = CGameClient::ShouldUsePredictedChar((CGameClient *)in_RDI,ClientID), bVar1)) {
      _local_10 = CGameClient::GetCharPos
                            (in_R8,ClientID_00,SUB41((uint)in_stack_ffffffffffffff88 >> 0x18,0));
    }
  }
  pIVar2 = CComponent::Graphics((CComponent *)0x16d831);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])();
  pIVar2 = CComponent::Graphics((CComponent *)0x16d847);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x13])
            (pIVar2,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
  pIVar2 = CComponent::Graphics((CComponent *)0x16d879);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x17])();
  CComponent::RenderTools((CComponent *)0x16d892);
  CRenderTools::SelectSprite
            ((CRenderTools *)in_R8,ClientID_00,in_stack_ffffffffffffff88,(int)in_RDI.field_1,
             (int)in_RDI.field_0);
  pIVar2 = CComponent::Graphics((CComponent *)0x16d8be);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])(0);
  this_01 = (CQuadItem *)&stack0xffffffffffffffbc;
  IGraphics::CQuadItem::CQuadItem(this_01,local_10.x,aStack_c.y + -31.5,42.0,84.0);
  pIVar2 = CComponent::Graphics((CComponent *)0x16d910);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x1c])(pIVar2,this_01,1);
  pIVar2 = CComponent::Graphics((CComponent *)0x16d932);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CItems::RenderFlag(const CNetObj_Flag *pPrev, const CNetObj_Flag *pCurrent, const CNetObj_GameDataFlag *pPrevGameDataFlag, const CNetObj_GameDataFlag *pCurGameDataFlag)
{
	const float Size = 42.0f;
	vec2 Pos = mix(vec2(pPrev->m_X, pPrev->m_Y), vec2(pCurrent->m_X, pCurrent->m_Y), Client()->IntraGameTick());

	if(pCurGameDataFlag)
	{
		// make sure that the flag isn't interpolated between capture and return
		if(pPrevGameDataFlag &&
			((pCurrent->m_Team == TEAM_RED && pPrevGameDataFlag->m_FlagCarrierRed != pCurGameDataFlag->m_FlagCarrierRed) ||
			(pCurrent->m_Team == TEAM_BLUE && pPrevGameDataFlag->m_FlagCarrierBlue != pCurGameDataFlag->m_FlagCarrierBlue)))
			Pos = vec2(pCurrent->m_X, pCurrent->m_Y);

		int FlagCarrier = -1;
		if(pCurrent->m_Team == TEAM_RED && pCurGameDataFlag->m_FlagCarrierRed >= 0)
			FlagCarrier = pCurGameDataFlag->m_FlagCarrierRed;
		else if(pCurrent->m_Team == TEAM_BLUE && pCurGameDataFlag->m_FlagCarrierBlue >= 0)
			FlagCarrier = pCurGameDataFlag->m_FlagCarrierBlue;

		// make sure to use predicted position
		if(FlagCarrier >= 0 && FlagCarrier < MAX_CLIENTS && m_pClient->ShouldUsePredicted() && m_pClient->ShouldUsePredictedChar(FlagCarrier))
			Pos = m_pClient->GetCharPos(FlagCarrier, true);
	}

	Graphics()->BlendNormal();
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();
	RenderTools()->SelectSprite(pCurrent->m_Team == TEAM_RED ? SPRITE_FLAG_RED : SPRITE_FLAG_BLUE);
	Graphics()->QuadsSetRotation(0.0f);
	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y-Size*0.75f, Size, Size*2);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsEnd();
}